

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlAutomataStatePtr xmlAutomataNewState(xmlAutomataPtr am)

{
  xmlAutomataStatePtr to;
  xmlAutomataPtr am_local;
  
  if (am == (xmlAutomataPtr)0x0) {
    am_local = (xmlAutomataPtr)0x0;
  }
  else {
    am_local = (xmlAutomataPtr)xmlRegNewState(am);
    xmlRegStatePush(am,(xmlRegStatePtr)am_local);
  }
  return (xmlAutomataStatePtr)am_local;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewState(xmlAutomataPtr am) {
    xmlAutomataStatePtr to;

    if (am == NULL)
	return(NULL);
    to = xmlRegNewState(am);
    xmlRegStatePush(am, to);
    return(to);
}